

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_ping.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  uint32_t packetsize;
  string addr;
  result_t ping_result;
  dev_ping p;
  uint local_d4;
  string local_d0;
  result_t local_b0;
  dev_ping local_60;
  
  puts("Ping device:");
  if (argc < 2) {
    display_usage();
    iVar5 = -1;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_d4 = 0;
    do {
      iVar5 = getopt(argc,argv,"hs:f");
      if (iVar5 == 0x66) {
        puts("\t fragmentation off by default (TODO)");
      }
      else if (iVar5 == 0x73) {
        if (_optarg != 0) {
          __isoc99_sscanf(_optarg,"%u",&local_d4);
          printf("\t packetsize %u\n",(ulong)local_d4);
        }
      }
      else {
        if (iVar5 == 0x68) {
          display_usage();
          goto LAB_001025b1;
        }
        printf("\t ping \'%s\'\n");
        sVar3 = local_d0._M_string_length;
        pcVar6 = argv[_optind];
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)sVar3,(ulong)pcVar6);
      }
    } while (iVar5 != -1);
    if ((char *)local_d0._M_string_length == (char *)0x0) {
      iVar5 = -2;
    }
    else {
      dev_ping::dev_ping(&local_60);
      paVar1 = &local_b0.from_addr.field_2;
      local_b0.from_addr._M_string_length = 0;
      local_b0.from_addr.field_2._M_local_buf[0] = '\0';
      paVar2 = &local_b0.status.field_2;
      local_b0.status._M_string_length = 0;
      local_b0.status.field_2._M_local_buf[0] = '\0';
      local_b0.from_addr._M_dataplus._M_p = (pointer)paVar1;
      local_b0.status._M_dataplus._M_p = (pointer)paVar2;
      if (local_d4 != 0) {
        dev_ping::setSize(&local_60,(uint16_t)local_d4);
      }
      bVar4 = dev_ping::check(&local_60,&local_d0,&local_b0);
      pcVar6 = "fail";
      if (bVar4) {
        pcVar6 = "ok";
      }
      printf("Ping: %s\n",pcVar6);
      printf("%s",local_b0.status._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.status._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0.status._M_dataplus._M_p,
                        CONCAT71(local_b0.status.field_2._M_allocated_capacity._1_7_,
                                 local_b0.status.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.from_addr._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.from_addr._M_dataplus._M_p,
                        CONCAT71(local_b0.from_addr.field_2._M_allocated_capacity._1_7_,
                                 local_b0.from_addr.field_2._M_local_buf[0]) + 1);
      }
      dev_ping::~dev_ping(&local_60);
LAB_001025b1:
      iVar5 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
//    setbuf(stdout, NULL); // TODO: remove, need only for debug on cross gdb
    printf("Ping device:\n");

    if (argc < 2) {
        display_usage();
        return -1;
    }
    const char *short_options = {"hs:f"}; // x: - mean x have parametr

    std::string addr;
    uint32_t packetsize = 0;
    bool fragmentation = false;

    int opt;
    do {
        opt = getopt(argc, argv, short_options);
        switch (opt) {
            case 'h': {
                display_usage();
                return 0;
            } break;

            case 's': {
                if (optarg) {
                    sscanf(optarg, "%u", &packetsize);
                    printf("\t packetsize %u\n", packetsize);
                }
            } break;

            case 'f': {
                printf("\t fragmentation off by default (TODO)\n");
            } break;

            default: {
                printf("\t ping '%s'\n", argv[optind]);
                addr.assign(argv[optind]);
            } break;
        }
    } while (opt != -1);

    if (addr.empty()) return -2;

    dev_ping p;
    dev_ping::result_t ping_result;
    if (packetsize) p.setSize(packetsize);
    bool ok = p.check(addr, &ping_result);
    printf("Ping: %s\n", ok ? "ok" : "fail");
    printf("%s", ping_result.status.c_str());

    return 0;
}